

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture2ReadTestBase<unsigned_char,_4U,_32856U>::runTest
          (ktxTexture2ReadTestBase<unsigned_char,_4U,_32856U> *this)

{
  bool bVar1;
  long in_RDI;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  ktx_size_t levelOffset;
  ktx_uint32_t level;
  ktx_size_t baseOffset;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_error_code_e result;
  ktxTexture2 *texture2;
  char (*in_stack_fffffffffffffe28) [28];
  ktxTexture2 *in_stack_fffffffffffffe30;
  texinfo *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  Message *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  AssertHelper *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe90;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  AssertionResult *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 uVar2;
  AssertionResult local_148;
  undefined1 local_138 [12];
  uint local_12c;
  undefined8 local_128;
  undefined8 local_110;
  AssertionResult local_108 [2];
  undefined1 local_e2;
  undefined1 local_e1;
  AssertionResult local_e0 [2];
  undefined4 local_bc;
  AssertionResult local_b8;
  uint local_a4;
  string local_a0 [40];
  undefined8 local_78;
  undefined1 local_61;
  AssertionResult local_60 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  undefined4 local_14;
  long local_10 [2];
  
  local_10[0] = 0;
  local_14 = ktxTexture2_CreateFromMemory
                       (*(undefined8 *)(in_RDI + 0x180),*(undefined8 *)(in_RDI + 0x188),1,local_10);
  local_2c = 0;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             (ktx_error_code_e *)in_stack_fffffffffffffe38,&in_stack_fffffffffffffe30->classId);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    testing::AssertionResult::failure_message((AssertionResult *)0x156c19);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe60,(Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
               (char *)in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
               in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (Message *)in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
    testing::Message::~Message((Message *)0x156c76);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x156ce4);
  local_61 = local_10[0] != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffe30,(bool *)in_stack_fffffffffffffe28,
             (type *)0x156d12);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    in_stack_fffffffffffffe60 =
         (AssertHelper *)
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe58 = ktxErrorString(local_14);
    local_78 = in_stack_fffffffffffffe58;
    in_stack_fffffffffffffe50 =
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffffe30,(char **)in_stack_fffffffffffffe28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               (char *)in_stack_fffffffffffffe98._M_head_impl,in_stack_fffffffffffffe90);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe60,(Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
               (char *)in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
               in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (Message *)in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
    std::__cxx11::string::~string(local_a0);
    testing::Message::~Message((Message *)0x156e36);
  }
  local_a4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x156ee0);
  if (local_a4 == 0) {
    local_bc = 2;
    testing::internal::EqHelper::Compare<class_id,_class_id,_nullptr>
              (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
               (class_id *)in_stack_fffffffffffffe38,&in_stack_fffffffffffffe30->classId);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe60);
      in_stack_fffffffffffffe48 =
           testing::AssertionResult::failure_message((AssertionResult *)0x156f6e);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe60,(Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                 (char *)in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                 in_stack_fffffffffffffe40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (Message *)in_stack_fffffffffffffea8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
      testing::Message::~Message((Message *)0x156fcb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x157039);
    local_e1 = WriterTestHelper<unsigned_char,_4U,_32856U>::texinfo::compare
                         (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    local_e2 = 1;
    testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
              (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,(bool *)in_stack_fffffffffffffe38
               ,(bool *)in_stack_fffffffffffffe30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe60);
      in_stack_fffffffffffffe40 =
           testing::AssertionResult::failure_message((AssertionResult *)0x1570d8);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe60,(Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                 (char *)in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                 in_stack_fffffffffffffe40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (Message *)in_stack_fffffffffffffea8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
      testing::Message::~Message((Message *)0x157135);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1571a3);
    local_110 = 0;
    testing::internal::CmpHelperNE<ktxKVListEntry*,ktxKVListEntry*>
              (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
               (ktxKVListEntry **)in_stack_fffffffffffffe38,
               (ktxKVListEntry **)in_stack_fffffffffffffe30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_108);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe60);
      in_stack_fffffffffffffe38 =
           (texinfo *)testing::AssertionResult::failure_message((AssertionResult *)0x157224);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe60,(Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                 (char *)in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                 in_stack_fffffffffffffe40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (Message *)in_stack_fffffffffffffea8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
      testing::Message::~Message((Message *)0x157281);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1572f2);
    local_128 = *(undefined8 *)
                 (*(long *)(in_RDI + 0x198) + (ulong)(*(int *)(in_RDI + 0x10) - 1) * 0x18);
    for (local_12c = 0; local_12c < *(uint *)(local_10[0] + 0x34); local_12c = local_12c + 1) {
      local_14 = ktxTexture2_GetImageOffset(local_10[0],local_12c,0,0,local_138);
      uVar2 = 0;
      testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                 (ktx_error_code_e *)in_stack_fffffffffffffe38,&in_stack_fffffffffffffe30->classId);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe60);
        in_stack_fffffffffffffe30 =
             (ktxTexture2 *)testing::AssertionResult::failure_message((AssertionResult *)0x1573de);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe60,(Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                   (char *)in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20)
                   ,in_stack_fffffffffffffe40);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(uVar2,in_stack_fffffffffffffeb0),
                   (Message *)in_stack_fffffffffffffea8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
        testing::Message::~Message((Message *)0x157432);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x15749d);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                 (unsigned_long *)in_stack_fffffffffffffe38,
                 (unsigned_long *)in_stack_fffffffffffffe30);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffe90);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe60);
        testing::AssertionResult::failure_message((AssertionResult *)0x157529);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe60,(Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                   (char *)in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20)
                   ,in_stack_fffffffffffffe40);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(uVar2,in_stack_fffffffffffffeb0),
                   (Message *)in_stack_fffffffffffffea8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
        testing::Message::~Message((Message *)0x157575);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1575d7);
    }
    ktxTexture2_destruct(local_10[0]);
  }
  return;
}

Assistant:

void runTest() {
        ktxTexture2* texture2 = 0;
        KTX_error_code result;

        result = ktxTexture2_CreateFromMemory(ktx2MemFile, ktx2MemFileLen,
                                        KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                        &texture2);

        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture2 != NULL) << "ktxTexture2_Create failed: "
                                      << ktxErrorString(result);

        EXPECT_EQ(texture2->classId, ktxTexture2_c);
        EXPECT_EQ(helper.texinfo.compare(texture2), true);
        EXPECT_NE(texture2->kvDataHead, (ktxKVListEntry*)0);

        // Check the levelOffsets are as expected.
        ktx_size_t baseOffset = levelIndex[helper.numLevels - 1].byteOffset;
        for (ktx_uint32_t level = 0; level < texture2->numLevels; level++) {
            ktx_size_t levelOffset;
            result = ktxTexture2_GetImageOffset(texture2, level, 0, 0,
                                                &levelOffset);
            EXPECT_EQ(result, KTX_SUCCESS);
            EXPECT_EQ(levelOffset, levelIndex[level].byteOffset - baseOffset);
        }

        ktxTexture2_destruct(texture2);

    }